

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

bool __thiscall woff2::Buffer::ReadU32(Buffer *this,uint32_t *value)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = this->length_;
  uVar1 = this->offset_ + 4;
  if (uVar1 <= uVar3) {
    uVar2 = *(uint *)(this->buffer_ + this->offset_);
    *value = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    this->offset_ = uVar1;
  }
  return uVar1 <= uVar3;
}

Assistant:

bool ReadU32(uint32_t *value) {
    if (offset_ + 4 > length_) {
      return FONT_COMPRESSION_FAILURE();
    }
    std::memcpy(value, buffer_ + offset_, sizeof(uint32_t));
    *value = ntohl(*value);
    offset_ += 4;
    return true;
  }